

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileutils.c
# Opt level: O0

void write_other_cert(scep *s)

{
  stack_st_X509 *sk;
  undefined4 uVar1;
  int iVar2;
  OPENSSL_STACK *pOVar3;
  X509 *a;
  X509_NAME *pXVar4;
  char *pcVar5;
  char *pcVar6;
  ASN1_INTEGER *x;
  char local_438 [8];
  char buffer [1024];
  int i;
  FILE *fp;
  X509 *cert;
  stack_st_X509 *certs;
  PKCS7 *p7;
  scep *s_local;
  
  othercert = (X509 *)0x0;
  sk = ((s->reply_p7->d).sign)->cert;
  buffer[0x3fc] = '\0';
  buffer[0x3fd] = '\0';
  buffer[0x3fe] = '\0';
  buffer[0x3ff] = '\0';
  while( true ) {
    uVar1 = buffer._1020_4_;
    pOVar3 = ossl_check_const_X509_sk_type(sk);
    iVar2 = OPENSSL_sk_num(pOVar3);
    a = (X509 *)othercert;
    if (iVar2 <= (int)uVar1) break;
    pOVar3 = ossl_check_const_X509_sk_type(sk);
    a = (X509 *)OPENSSL_sk_value(pOVar3,buffer._1020_4_);
    if (v_flag != 0) {
      pXVar4 = X509_get_subject_name(a);
      pcVar5 = X509_NAME_oneline(pXVar4,local_438,0x400);
      pXVar4 = X509_get_issuer_name(a);
      pcVar6 = X509_NAME_oneline(pXVar4,local_438,0x400);
      log_log(1,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/fileutils.c"
              ,0xa1,"found certificate with\n subject: %s\n issuer: %s",pcVar5,pcVar6);
    }
    x = X509_get_serialNumber(a);
    iVar2 = ASN1_INTEGER_cmp(x,(ASN1_INTEGER *)s->ias_getcert->serial);
    if (iVar2 == 0) break;
    buffer._1020_4_ = buffer._1020_4_ + 1;
  }
  othercert = (X509 *)a;
  if (othercert != (X509 *)0x0) {
    write_cert(othercert,w_char);
    return;
  }
  log_log(4,
          "/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/fileutils.c"
          ,0xaa,"cannot find certificate");
  exit(0x5d);
}

Assistant:

void write_other_cert(struct scep *s) {
    PKCS7           *p7;
    STACK_OF(X509)  *certs;
    X509            *cert = NULL;
    FILE            *fp;
    int             i;

    othercert = NULL;

    // Get certs
    p7 = s->reply_p7;
    certs = p7->d.sign->cert;

    // Find cert
    for (i = 0; i < sk_X509_num(certs); i++) {
        char buffer[1024];

        cert = sk_X509_value(certs, i);
        if (v_flag) {
            log_debug("found certificate with\n subject: %s\n issuer: %s",
                      X509_NAME_oneline(X509_get_subject_name(cert), buffer, sizeof(buffer)),
                      X509_NAME_oneline(X509_get_issuer_name(cert), buffer, sizeof(buffer)));
        }
        // The serial has to match to requested one
        if (!ASN1_INTEGER_cmp(X509_get_serialNumber(cert), s->ias_getcert->serial)) {
            othercert = cert;
            break;
        }
    }
    if (othercert == NULL) {
        log_error("cannot find certificate");
        exit (SCEP_PKISTATUS_FILE);
    }
    write_cert(othercert, w_char);
}